

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileMtlImporter::load(ObjFileMtlImporter *this)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  ObjFileMtlImporter *local_10;
  ObjFileMtlImporter *this_local;
  
  local_10 = this;
  bVar2 = __gnu_cxx::operator==(&this->m_DataIt,&this->m_DataItEnd);
  if (!bVar2) {
    while (bVar2 = __gnu_cxx::operator!=(&this->m_DataIt,&this->m_DataItEnd), bVar2) {
      pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt);
      switch(*pcVar3) {
      case 'K':
      case 'k':
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&this->m_DataIt);
        pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&this->m_DataIt);
        if (*pcVar3 == 'a') {
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++(&this->m_DataIt);
          getColorRGBA(this,&this->m_pModel->m_pCurrentMaterial->ambient);
        }
        else {
          pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&this->m_DataIt);
          if (*pcVar3 == 'd') {
            __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
            operator++(&this->m_DataIt);
            getColorRGBA(this,&this->m_pModel->m_pCurrentMaterial->diffuse);
          }
          else {
            pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&this->m_DataIt);
            if (*pcVar3 == 's') {
              __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
              operator++(&this->m_DataIt);
              getColorRGBA(this,&this->m_pModel->m_pCurrentMaterial->specular);
            }
            else {
              pcVar3 = __gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator*(&this->m_DataIt);
              if (*pcVar3 == 'e') {
                __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                operator++(&this->m_DataIt);
                getColorRGBA(this,&this->m_pModel->m_pCurrentMaterial->emissive);
              }
            }
          }
        }
        local_20 = (this->m_DataIt)._M_current;
        local_28 = (this->m_DataItEnd)._M_current;
        local_18 = (char *)skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                                     ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                       )local_20,
                                      (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                       )local_28,&this->m_uiLine);
        (this->m_DataIt)._M_current = local_18;
        break;
      default:
        _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,
                           &this->m_uiLine);
        (this->m_DataIt)._M_current = _Var4._M_current;
        break;
      case 'N':
      case 'n':
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&this->m_DataIt);
        pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&this->m_DataIt);
        cVar1 = *pcVar3;
        if (cVar1 == 'e') {
          createMaterial(this);
        }
        else if (cVar1 == 'i') {
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++(&this->m_DataIt);
          getFloatValue(this,&this->m_pModel->m_pCurrentMaterial->ior);
        }
        else if (cVar1 == 's') {
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++(&this->m_DataIt);
          getFloatValue(this,&this->m_pModel->m_pCurrentMaterial->shineness);
        }
        _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,
                           &this->m_uiLine);
        (this->m_DataIt)._M_current = _Var4._M_current;
        break;
      case 'T':
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&this->m_DataIt);
        pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&this->m_DataIt);
        if (*pcVar3 == 'f') {
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++(&this->m_DataIt);
          getColorRGBA(this,&this->m_pModel->m_pCurrentMaterial->transparent);
        }
        local_38 = (this->m_DataIt)._M_current;
        local_40 = (this->m_DataItEnd)._M_current;
        local_30 = (char *)skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                                     ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                       )local_38,
                                      (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                       )local_40,&this->m_uiLine);
        (this->m_DataIt)._M_current = local_30;
        break;
      case 'b':
      case 'm':
      case 'r':
        getTexture(this);
        _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,
                           &this->m_uiLine);
        (this->m_DataIt)._M_current = _Var4._M_current;
        break;
      case 'd':
        local_48 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&this->m_DataIt,1);
        pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_48);
        bVar2 = false;
        if (*pcVar3 == 'i') {
          local_50 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator+(&this->m_DataIt,2);
          pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&local_50);
          bVar2 = false;
          if (*pcVar3 == 's') {
            local_58 = __gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(&this->m_DataIt,3);
            pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&local_58);
            bVar2 = *pcVar3 == 'p';
          }
        }
        if (bVar2) {
          getTexture(this);
        }
        else {
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++(&this->m_DataIt);
          getFloatValue(this,&this->m_pModel->m_pCurrentMaterial->alpha);
          _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                            ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,
                             &this->m_uiLine);
          (this->m_DataIt)._M_current = _Var4._M_current;
        }
        break;
      case 'i':
        _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
        (this->m_DataIt)._M_current = _Var4._M_current;
        getIlluminationModel(this,&this->m_pModel->m_pCurrentMaterial->illumination_model);
        _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,
                           &this->m_uiLine);
        (this->m_DataIt)._M_current = _Var4._M_current;
      }
    }
  }
  return;
}

Assistant:

void ObjFileMtlImporter::load()
{
    if ( m_DataIt == m_DataItEnd )
        return;

    while ( m_DataIt != m_DataItEnd )
    {
        switch (*m_DataIt)
        {
        case 'k':
        case 'K':
            {
                ++m_DataIt;
                if (*m_DataIt == 'a') // Ambient color
                {
                    ++m_DataIt;
                    getColorRGBA( &m_pModel->m_pCurrentMaterial->ambient );
                }
                else if (*m_DataIt == 'd')  // Diffuse color
                {
                    ++m_DataIt;
                    getColorRGBA( &m_pModel->m_pCurrentMaterial->diffuse );
                }
                else if (*m_DataIt == 's')
                {
                    ++m_DataIt;
                    getColorRGBA( &m_pModel->m_pCurrentMaterial->specular );
                }
                else if (*m_DataIt == 'e')
                {
                    ++m_DataIt;
                    getColorRGBA( &m_pModel->m_pCurrentMaterial->emissive );
                }
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;
        case 'T':
            {
                ++m_DataIt;
                if (*m_DataIt == 'f') // Material transmission
                {
                    ++m_DataIt;
                    getColorRGBA( &m_pModel->m_pCurrentMaterial->transparent);
                }
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;
        case 'd':
            {
                if( *(m_DataIt+1) == 'i' && *( m_DataIt + 2 ) == 's' && *( m_DataIt + 3 ) == 'p' ) {
                    // A displacement map
                    getTexture();
                } else {
                    // Alpha value
                    ++m_DataIt;
                    getFloatValue( m_pModel->m_pCurrentMaterial->alpha );
                    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
                }
            }
            break;

        case 'N':
        case 'n':
            {
                ++m_DataIt;
                switch(*m_DataIt)
                {
                case 's':   // Specular exponent
                    ++m_DataIt;
                    getFloatValue(m_pModel->m_pCurrentMaterial->shineness);
                    break;
                case 'i':   // Index Of refraction
                    ++m_DataIt;
                    getFloatValue(m_pModel->m_pCurrentMaterial->ior);
                    break;
                case 'e':   // New material
                    createMaterial();
                    break;
                }
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;

        case 'm':   // Texture
        case 'b':   // quick'n'dirty - for 'bump' sections
        case 'r':   // quick'n'dirty - for 'refl' sections
            {
                getTexture();
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;

        case 'i':   // Illumination model
            {
                m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
                getIlluminationModel( m_pModel->m_pCurrentMaterial->illumination_model );
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;

        default:
            {
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;
        }
    }
}